

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_reportModelDense(HModel *this)

{
  pointer piVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  int j;
  long lVar6;
  int i;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char buff [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"N=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->numCol);
  poVar2 = std::operator<<(poVar2,",  M=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->numRow);
  poVar2 = std::operator<<(poVar2,",  NZ= ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numCol]);
  std::operator<<(poVar2,'\n');
  if ((this->numCol < 0xb) && (this->numRow < 0x65)) {
    std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
    uVar8 = (ulong)((long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 3;
    uVar4 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar4;
    }
    for (; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      sprintf(buff,"%2.1g ",
              (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4]);
      std::operator<<((ostream *)&std::cout,buff);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"------A------\n");
    for (iVar7 = 0; iVar7 < this->numRow; iVar7 = iVar7 + 1) {
      for (lVar6 = 0; lVar6 < this->numCol; lVar6 = lVar6 + 1) {
        piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar3 = (long)piVar1[lVar6];
            (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] != iVar7; lVar3 = lVar3 + 1) {
          if (piVar1[lVar6 + 1] <= lVar3) {
            pcVar5 = " ";
            goto LAB_00134e04;
          }
        }
        pcVar5 = " ";
        if ((int)lVar3 < piVar1[lVar6 + 1]) {
          sprintf(buff,"%2.1g ",
                  (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3]);
          pcVar5 = buff;
        }
LAB_00134e04:
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,pcVar5);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    std::operator<<((ostream *)&std::cout,"------LB------\n");
    for (lVar6 = 0; lVar6 < this->numRow; lVar6 = lVar6 + 1) {
      if ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] <= -1e+200) {
        builtin_strncpy(buff,"-inf",5);
      }
      else {
        sprintf(buff,"%2.1g ");
      }
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,buff);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"------UB------\n");
    for (lVar6 = 0; lVar6 < this->numRow; lVar6 = lVar6 + 1) {
      if (1e+200 <= (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6]) {
        builtin_strncpy(buff,"inf",4);
      }
      else {
        sprintf(buff,"%2.1g ");
      }
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,buff);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void HModel::util_reportModelDense() {
  cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';	
  if (numCol>10 || numRow>100) return;
  cout<<"\n-----cost-----\n";
  
  char buff [16];
  int colCostSz = colCost.size();
  for (int i=0; i<colCostSz; i++) { 
    sprintf(buff, "%2.1g ", colCost[i]);
    cout<<buff; 
  }
  cout<<endl;
  cout<<"------A------\n";
  for (int i=0;i<numRow;i++) {
    for (int j=0;j<numCol;j++) {
      
      int ind = Astart[j];
      while (Aindex[ind]!=i && ind<Astart[j+1]) 
	ind++;
      
      
      //if a_ij is nonzero print
      if (Aindex[ind]==i && ind<Astart[j+1])
	{	
	  sprintf(buff, "%2.1g ", Avalue[ind]);
	  cout<<setw(5)<<buff;
	}
      else cout<<setw(5)<<" ";
      
    }
    cout<<endl;
  }
  cout<<"------LB------\n";
  for (int i=0;i<numRow;i++) { 	
    if (rowLower[i]>-HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowLower[i]);
    else 
      sprintf(buff, "-inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
  cout<<"------UB------\n";
  for (int i=0;i<numRow;i++) { 
    if (rowUpper[i]<HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowUpper[i]);
    else 
      sprintf(buff, "inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
}